

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>::
linear_search_impl<int,std::greater<int>>
          (btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
           *this,int *k,int s,int e,greater<int> *comp)

{
  bool bVar1;
  key_type *__x;
  greater<int> *comp_local;
  int e_local;
  int s_local;
  int *k_local;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  *this_local;
  
  comp_local._4_4_ = s;
  while( true ) {
    if (e <= comp_local._4_4_) {
      return (SearchResult<int,_false>)comp_local._4_4_;
    }
    __x = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
          ::key((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                 *)this,(long)comp_local._4_4_);
    bVar1 = std::greater<int>::operator()(comp,__x,k);
    if (!bVar1) break;
    comp_local._4_4_ = comp_local._4_4_ + 1;
  }
  return (SearchResult<int,_false>)comp_local._4_4_;
}

Assistant:

SearchResult<int, false> linear_search_impl(
            const K &k, int s, const int e, const Compare &comp,
            std::false_type /* IsCompareTo */) const {
            while (s < e) {
                if (!comp(key(s), k)) {
                    break;
                }
                ++s;
            }
            return {s};
        }